

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_object.cpp
# Opt level: O2

string __thiscall mjs::error_object::to_string(error_object *this)

{
  gc_heap *h;
  wostream *pwVar1;
  undefined8 extraout_RDX;
  error_object *in_RSI;
  wstring_view wVar2;
  string sVar3;
  wostringstream woss;
  gc_heap_ptr_untyped gStack_218;
  gc_heap_ptr_untyped local_208;
  double local_1f8;
  anon_union_32_5_7b1e0779_for_value_3 local_1f0;
  double local_1d0;
  anon_union_32_5_7b1e0779_for_value_3 local_1c8;
  undefined8 local_1a8;
  wchar_t *local_1a0;
  wostringstream local_198 [376];
  
  h = (in_RSI->super_native_object).super_object.heap_;
  std::__cxx11::wostringstream::wostringstream(local_198);
  get_name((value *)&local_1f8,in_RSI);
  mjs::to_string((mjs *)&local_208,h,(value *)&local_1f8);
  wVar2 = string::view((string *)&local_208);
  pwVar1 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                     ((wostream *)local_198,wVar2._M_str,wVar2._M_len);
  pwVar1 = std::operator<<(pwVar1,": ");
  local_1a8 = 7;
  local_1a0 = L"message";
  (**(in_RSI->super_native_object).super_object._vptr_object)(&local_1d0);
  mjs::to_string((mjs *)&gStack_218,h,(value *)&local_1d0);
  wVar2 = string::view((string *)&gStack_218);
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar1,wVar2._M_str,wVar2._M_len);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&gStack_218);
  value::~value((value *)&local_1d0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_208);
  value::~value((value *)&local_1f8);
  std::__cxx11::wstringbuf::str();
  local_1d0 = local_1f0.n_;
  local_1c8.n_ = local_1f8;
  string::string((string *)this,h,(wstring_view *)&local_1d0);
  std::__cxx11::wstring::~wstring((wstring *)&local_1f8);
  std::__cxx11::wostringstream::~wostringstream(local_198);
  sVar3.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  sVar3.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (string)sVar3.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped;
}

Assistant:

string to_string() const {
        auto& h = heap();
        std::wostringstream woss;
        woss << mjs::to_string(h, get_name()).view() << ": " << mjs::to_string(h, get(L"message")).view();
        return string{h, woss.str()};
    }